

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O1

Index __thiscall CPT::Sample(CPT *this,Index y)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  double dVar5;
  ulong uVar4;
  
  iVar2 = rand();
  uVar1 = (this->_m_probTable).size1_;
  if (uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    dVar5 = 0.0;
    uVar4 = 0;
    do {
      dVar5 = dVar5 + (this->_m_probTable).data_.data_
                      [(ulong)y + uVar4 * (this->_m_probTable).size2_];
      if ((double)iVar2 * 4.656612873077393e-10 <= dVar5) {
        return (Index)uVar4;
      }
      uVar3 = (Index)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar4 < uVar1);
  }
  return uVar3;
}

Assistant:

Index CPT::Sample(Index y) const
{
    double randNr=rand() / (RAND_MAX + 1.0);
    double cumprob = 0.0;
    Index x;
    for(x=0; x < nrX(); x++)
    {
        cumprob += _m_probTable(x,y);
        if(randNr<=cumprob)
            break;
    }
    return(x);    
}